

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool mkvmuxer::anon_unknown_12::CopyChromaticity
               (PrimaryChromaticity *src,PrimaryChromaticityPtr *dst)

{
  pointer __p;
  
  if (dst != (PrimaryChromaticityPtr *)0x0) {
    __p = (pointer)operator_new(8,(nothrow_t *)&std::nothrow);
    if (__p != (pointer)0x0) {
      *__p = *src;
    }
    std::
    __uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
    ::reset((__uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
             *)dst,__p);
    return (dst->_M_t).
           super___uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
           ._M_t.
           super__Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
           .super__Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false>._M_head_impl !=
           (PrimaryChromaticity *)0x0;
  }
  return false;
}

Assistant:

bool CopyChromaticity(const PrimaryChromaticity* src,
                      PrimaryChromaticityPtr* dst) {
  if (!dst)
    return false;

  dst->reset(new (std::nothrow) PrimaryChromaticity(src->x(), src->y()));
  if (!dst->get())
    return false;

  return true;
}